

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadBodyForce::ComputeQ(ChLoadBodyForce *this,ChState *state_x,ChStateDelta *state_w)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  element_type *peVar8;
  int iVar9;
  long *plVar10;
  long lVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChVectorDynamic<> mF;
  double detJ;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  double local_78;
  double local_68;
  double local_60;
  double *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined1 local_30 [8];
  
  peVar8 = (this->super_ChLoadCustom).loadable.
           super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar8 == (element_type *)0x0) {
    plVar10 = (long *)0x0;
  }
  else {
    plVar10 = (long *)__dynamic_cast(peVar8,&ChLoadable::typeinfo,&ChBody::typeinfo,
                                     0xffffffffffffffff);
  }
  if (plVar10 == (long *)0x0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    plVar10 = (long *)0x0;
  }
  else {
    this_00 = (this->super_ChLoadCustom).loadable.
              super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  lVar11 = (**(code **)(*plVar10 + 0x1e0))(plVar10);
  if (*(char *)(lVar11 + 0x2c) == '\0') {
    if (this->m_local_force == true) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (this->m_force).m_data[0];
      dVar1 = (this->m_force).m_data[1];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = plVar10[0x17];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar1 * (double)plVar10[0x18];
      auVar2 = vfmadd231sd_fma(auVar15,auVar12,auVar2);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (this->m_force).m_data[2];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = plVar10[0x19];
      auVar2 = vfmadd231sd_fma(auVar2,auVar14,auVar3);
      local_40 = auVar2._0_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = plVar10[0x1a];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar1 * (double)plVar10[0x1b];
      auVar2 = vfmadd231sd_fma(auVar16,auVar12,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = plVar10[0x1c];
      auVar2 = vfmadd231sd_fma(auVar2,auVar14,auVar5);
      local_48 = auVar2._0_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = plVar10[0x1d];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar1 * (double)plVar10[0x1e];
      auVar2 = vfmadd231sd_fma(auVar13,auVar12,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = plVar10[0x1f];
      auVar2 = vfmadd231sd_fma(auVar2,auVar14,auVar7);
      local_50 = auVar2._0_8_;
    }
    else {
      local_40 = (this->m_force).m_data[0];
      local_48 = (this->m_force).m_data[1];
      local_50 = (this->m_force).m_data[2];
    }
    local_38 = this->m_scale;
    if (this->m_local_point == true) {
      ChTransform<double>::TransformLocalToParent
                (&this->m_point,(ChVector<double> *)(plVar10 + 0x10),
                 (ChMatrix33<double> *)(plVar10 + 0x17));
      local_58 = local_88.m_storage.m_data;
      local_60 = (double)local_88.m_storage.m_rows;
    }
    else {
      local_58 = (double *)(this->m_point).m_data[0];
      local_60 = (this->m_point).m_data[1];
      local_78 = (this->m_point).m_data[2];
    }
    local_68 = local_78;
    iVar9 = (*((this->super_ChLoadCustom).loadable.
               super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ChLoadable[7])();
    local_88.m_storage.m_data = (double *)0x0;
    local_88.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_88,(long)iVar9);
    if (0 < local_88.m_storage.m_rows) {
      *local_88.m_storage.m_data = local_38 * local_40;
      if (((((double)local_88.m_storage.m_rows != 4.94065645841247e-324) &&
           (local_88.m_storage.m_data[1] = local_38 * local_48, 2 < local_88.m_storage.m_rows)) &&
          (local_88.m_storage.m_data[2] = local_38 * local_50,
          (double)local_88.m_storage.m_rows != 1.48219693752374e-323)) &&
         ((local_88.m_storage.m_data[3] = 0.0, 4 < local_88.m_storage.m_rows &&
          (local_88.m_storage.m_data[4] = 0.0,
          (double)local_88.m_storage.m_rows != 2.47032822920623e-323)))) {
        local_88.m_storage.m_data[5] = 0.0;
        (**(code **)(*plVar10 + 0x220))
                  (local_58,local_60,local_68,plVar10,&(this->super_ChLoadCustom).load_Q,local_30,
                   &local_88,state_x,state_w);
        if (local_88.m_storage.m_data != (double *)0x0) {
          free((void *)local_88.m_storage.m_data[-1]);
        }
        goto LAB_005d79bd;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_005d79bd:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void ChLoadBodyForce::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mbody = std::dynamic_pointer_cast<ChBody>(this->loadable);
    if (!mbody->Variables().IsActive())
        return;

    ChVector<> abs_force;
    if (m_local_force)
        abs_force = mbody->TransformDirectionLocalToParent(m_force);
    else
        abs_force = m_force;

    abs_force *= m_scale;

    ChVector<> abs_point;
    if (m_local_point)
        abs_point = mbody->TransformPointLocalToParent(m_point);
    else
        abs_point = m_point;

    // ChBody assumes F={force_abs, torque_abs}
    ChVectorDynamic<> mF(loadable->Get_field_ncoords());
    mF(0) = abs_force.x();
    mF(1) = abs_force.y();
    mF(2) = abs_force.z();
    mF(3) = 0;
    mF(4) = 0;
    mF(5) = 0;

    // Compute Q = N(u,v,w)'*F
    double detJ;  // not used
    mbody->ComputeNF(abs_point.x(), abs_point.y(), abs_point.z(), load_Q, detJ, mF, state_x, state_w);
}